

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O1

void Cnf_CutRef(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  void *pvVar4;
  
  if ('\0' < pCut->nFanins) {
    lVar3 = 0;
    do {
      pVVar2 = p->pManAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar1 = *(uint *)((long)pCut[1].vIsop + lVar3 * 4 + -8);
        if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar4 = pVVar2->pArray[uVar1];
      }
      if (pvVar4 == (void *)0x0) {
        return;
      }
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffff0000003f |
           (ulong)((int)*(ulong *)((long)pvVar4 + 0x18) + 0x40U & 0xffffffc0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < pCut->nFanins);
  }
  return;
}

Assistant:

void Cnf_CutRef( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        pObj->nRefs++;
    }
}